

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlineprops.cpp
# Opt level: O2

void test_stipples(Am_Drawonable *d)

{
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar2;
  undefined8 uVar1;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar4;
  undefined8 uVar3;
  undefined8 in_stack_ffffffffffffffb8;
  uint uVar6;
  ulong uVar5;
  Am_Style gray_line;
  Am_Style dark_gray_line;
  Am_Image_Array local_20 [8];
  Am_Image_Array local_18 [8];
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  uVar6 = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  Am_Image_Array::Am_Image_Array(local_18,0x4b);
  uVar5 = (ulong)uVar6 << 0x20;
  uVar3 = CONCAT44(uVar4,2);
  uVar1 = CONCAT44(uVar2,4);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&dark_gray_line,3,1,0,1,test_stipples::dash5_list,uVar1,
                     uVar3,uVar5,local_18);
  uVar2 = (undefined4)((ulong)uVar1 >> 0x20);
  uVar4 = (undefined4)((ulong)uVar3 >> 0x20);
  Am_Image_Array::~Am_Image_Array(local_18);
  Am_Image_Array::Am_Image_Array(local_20,0x32);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&gray_line,5,1,0,1,test_stipples::dash6_list,
                     CONCAT44(uVar2,2),CONCAT44(uVar4,2),uVar5 & 0xffffffff00000000,local_20);
  Am_Image_Array::~Am_Image_Array(local_20);
  (**(code **)(*(long *)d + 0x160))(d,&dark_gray_line,&Am_No_Style,10,0x140,100,0x32,0);
  (**(code **)(*(long *)d + 0x130))(d,&gray_line,&Am_No_Style,0x96,0x140,100,0x32,0,0x168,0,1);
  Am_Style::~Am_Style(&gray_line);
  Am_Style::~Am_Style(&dark_gray_line);
  return;
}

Assistant:

void
test_stipples(Am_Drawonable *d)
{

  static char dash5_list[4] = {20, 10, 5, 10};
  static char dash6_list[2] = {5, 20};

  Am_Style dark_gray_line(0.0f, 0.0f, 0.0f, 3, Am_CAP_BUTT, Am_JOIN_MITER,
                          Am_LINE_ON_OFF_DASH, dash5_list, 4, Am_FILL_STIPPLED,
                          Am_FILL_POLY_EVEN_ODD, Am_Image_Array(75));
  Am_Style gray_line(0.0f, 0.0f, 0.0f, 5, Am_CAP_BUTT, Am_JOIN_MITER,
                     Am_LINE_ON_OFF_DASH, dash6_list, 2, Am_FILL_STIPPLED,
                     Am_FILL_POLY_EVEN_ODD, Am_Image_Array(50));
  d->Draw_Rectangle(dark_gray_line, Am_No_Style, 10, 320, 100, 50);
  d->Draw_Arc(gray_line, Am_No_Style, 150, 320, 100, 50, 0, 360);
}